

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCBoolean.cpp
# Opt level: O3

void Assimp::IFC::ProcessBooleanHalfSpaceDifference
               (IfcHalfSpaceSolid *hs,TempMesh *result,TempMesh *first_operand,
               ConversionData *param_4)

{
  pointer *ppaVar1;
  pointer *ppuVar2;
  IfcVector3 *e0;
  undefined1 auVar3 [16];
  pointer pcVar4;
  uint *puVar5;
  pointer paVar6;
  aiVector3t<double> *paVar7;
  iterator __position;
  TempMesh *pTVar8;
  TempMesh *pTVar9;
  bool bVar10;
  bool bVar11;
  int iVar12;
  IfcSurface *pIVar13;
  long lVar14;
  IfcAxis2Placement3D *pIVar15;
  IfcDirection *in;
  IfcCartesianPoint *in_00;
  ulong uVar16;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  _Var17;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  _Var18;
  ulong uVar19;
  iterator iVar20;
  uint *puVar21;
  ulong uVar22;
  ulong uVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  double dVar28;
  char *unaff_retaddr;
  IfcVector3 isectpos;
  IfcVector3 p;
  IfcVector3 e1;
  uint local_104;
  TempMesh *local_100;
  ulong local_f8;
  TempMesh *local_f0;
  IfcVector3 local_e8;
  IfcVector3 local_c8;
  IfcVector3 local_a8;
  undefined1 local_88 [8];
  _Alloc_hider _Stack_80;
  double local_78;
  char local_70 [24];
  vector<unsigned_int,std::allocator<unsigned_int>> *local_58;
  uint *local_50;
  FuzzyVectorCompare local_48;
  double dStack_40;
  
  local_100 = result;
  local_f0 = first_operand;
  if (hs == (IfcHalfSpaceSolid *)0x0) {
    __assert_fail("hs != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCBoolean.cpp"
                  ,0x8f,
                  "void Assimp::IFC::ProcessBooleanHalfSpaceDifference(const Schema_2x3::IfcHalfSpaceSolid *, TempMesh &, const TempMesh &, ConversionData &)"
                 );
  }
  pIVar13 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcSurface>
                      (*(LazyObject **)&(hs->super_IfcGeometricRepresentationItem).field_0x30);
  lVar14 = __dynamic_cast((_func_int *)
                          ((long)&(pIVar13->super_IfcGeometricRepresentationItem).
                                  super_IfcRepresentationItem.
                                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                  ._vptr_ObjectHelper +
                          (long)(pIVar13->super_IfcGeometricRepresentationItem).
                                super_IfcRepresentationItem.
                                super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                ._vptr_ObjectHelper[-3]),&STEP::Object::typeinfo,
                          &Schema_2x3::IfcPlane::typeinfo,0xffffffffffffffff);
  if (lVar14 == 0) {
    LogFunctions<Assimp::IFCImporter>::LogError(unaff_retaddr);
    return;
  }
  local_a8.x = 0.0;
  local_a8.y = 0.0;
  local_a8.z = 0.0;
  local_e8.x = 0.0;
  local_e8.y = 0.0;
  local_e8.z = 1.0;
  pIVar15 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>
                      (*(LazyObject **)(lVar14 + 0x40));
  if (pIVar15->field_0x50 == '\x01') {
    pIVar15 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>
                        (*(LazyObject **)(lVar14 + 0x40));
    if (pIVar15->field_0x50 == '\0') {
      __assert_fail("have",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/./code/Step/STEPFile.h"
                    ,0x240,
                    "const T &Assimp::STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>>::Get() const [T = Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>]"
                   );
    }
    in = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcDirection>
                   (*(LazyObject **)&(pIVar15->super_IfcPlacement).field_0x48);
    ConvertDirection(&local_e8,in);
  }
  pIVar15 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>
                      (*(LazyObject **)(lVar14 + 0x40));
  in_00 = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcCartesianPoint>
                    (*(LazyObject **)
                      &(pIVar15->super_IfcPlacement).super_IfcGeometricRepresentationItem.field_0x30
                    );
  ConvertCartesianPoint(&local_a8,in_00);
  local_88 = (undefined1  [8])&PTR__PrimitiveDataType_008be228;
  pcVar4 = (hs->AgreementFlag)._M_dataplus._M_p;
  _Stack_80._M_p = local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&_Stack_80,pcVar4,pcVar4 + (hs->AgreementFlag)._M_string_length);
  local_88 = (undefined1  [8])&PTR__PrimitiveDataType_008be1f0;
  bVar10 = IsTrue((BOOLEAN *)local_88);
  local_88 = (undefined1  [8])&PTR__PrimitiveDataType_008be228;
  if (_Stack_80._M_p != local_70) {
    operator_delete(_Stack_80._M_p);
  }
  pTVar9 = local_f0;
  pTVar8 = local_100;
  if (!bVar10) {
    local_e8.x = -local_e8.x;
    local_e8.y = -local_e8.y;
    local_e8.z = -local_e8.z;
  }
  puVar21 = (local_f0->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start;
  puVar5 = (local_f0->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
            (&local_100->mVerts,
             ((long)(local_f0->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(local_f0->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_58 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&pTVar8->mVertcnt;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58,
             (long)(pTVar9->mVertcnt).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pTVar9->mVertcnt).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  local_50 = puVar5;
  if (puVar21 != puVar5) {
    local_f8 = 0;
    do {
      local_104 = 0;
      uVar16 = (ulong)*puVar21;
      if (*puVar21 != 0) {
        paVar6 = (local_f0->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        bVar10 = -1e-06 < (paVar6[local_f8].z - local_a8.z) * local_e8.z +
                          (paVar6[local_f8].x - local_a8.x) * local_e8.x +
                          (paVar6[local_f8].y - local_a8.y) * local_e8.y;
        uVar22 = 0;
        uVar19 = local_f8;
        uVar23 = 1;
        do {
          iVar12 = 0;
          if (uVar23 != uVar16) {
            iVar12 = (int)uVar23;
          }
          paVar6 = (local_f0->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          e0 = paVar6 + uVar19;
          local_78 = paVar6[(uint)(iVar12 + (int)local_f8)].z;
          local_88 = (undefined1  [8])paVar6[(uint)(iVar12 + (int)local_f8)].x;
          _Stack_80._M_p = (pointer)paVar6[(uint)(iVar12 + (int)local_f8)].y;
          local_c8.x = 0.0;
          local_c8.y = 0.0;
          local_c8.z = 0.0;
          bVar11 = IntersectSegmentPlane
                             (&local_a8,&local_e8,e0,(IfcVector3 *)local_88,bVar10,&local_c8);
          if (bVar11) {
            iVar20._M_current =
                 (local_100->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            paVar7 = (local_100->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
            if (bVar10 == false) {
              if (iVar20._M_current == paVar7) {
                std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                _M_realloc_insert<aiVector3t<double>const&>
                          ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                           local_100,iVar20,&local_c8);
              }
              else {
                (iVar20._M_current)->z = local_c8.z;
                (iVar20._M_current)->x = local_c8.x;
                (iVar20._M_current)->y = local_c8.y;
                ppaVar1 = &(local_100->mVerts).
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppaVar1 = *ppaVar1 + 1;
                local_104 = (uint)uVar22;
              }
              local_104 = local_104 + 1;
            }
            else {
              if (iVar20._M_current == paVar7) {
                std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                _M_realloc_insert<aiVector3t<double>const&>
                          ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                           local_100,iVar20,e0);
                iVar20._M_current =
                     (local_100->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
              }
              else {
                (iVar20._M_current)->z = e0->z;
                dVar27 = e0->y;
                (iVar20._M_current)->x = e0->x;
                (iVar20._M_current)->y = dVar27;
                iVar20._M_current =
                     (local_100->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
                (local_100->mVerts).
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_finish = iVar20._M_current;
              }
              if (iVar20._M_current ==
                  (local_100->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                _M_realloc_insert<aiVector3t<double>const&>
                          ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                           local_100,iVar20,&local_c8);
              }
              else {
                (iVar20._M_current)->z = local_c8.z;
                (iVar20._M_current)->x = local_c8.x;
                (iVar20._M_current)->y = local_c8.y;
                ppaVar1 = &(local_100->mVerts).
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                *ppaVar1 = *ppaVar1 + 1;
              }
              local_104 = local_104 + 2;
            }
            uVar22 = (ulong)local_104;
            bVar10 = (bool)(bVar10 ^ 1);
          }
          else if (bVar10 == false) {
            bVar10 = false;
          }
          else {
            iVar20._M_current =
                 (local_100->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar20._M_current ==
                (local_100->mVerts).
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
              _M_realloc_insert<aiVector3t<double>const&>
                        ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)local_100,
                         iVar20,e0);
            }
            else {
              (iVar20._M_current)->z = e0->z;
              dVar27 = e0->y;
              (iVar20._M_current)->x = e0->x;
              (iVar20._M_current)->y = dVar27;
              ppaVar1 = &(local_100->mVerts).
                         super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppaVar1 = *ppaVar1 + 1;
              local_104 = (uint)uVar22;
            }
            local_104 = local_104 + 1;
            uVar22 = (ulong)local_104;
            bVar10 = true;
          }
          uVar16 = (ulong)*puVar21;
          uVar19 = (ulong)((int)uVar19 + 1);
          bVar11 = uVar23 < uVar16;
          uVar23 = uVar23 + 1;
        } while (bVar11);
        if ((int)uVar22 != 0) {
          _Var18._M_current =
               (local_100->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
          lVar14 = 0;
          dVar28 = -10000000000.0;
          dVar27 = 10000000000.0;
          auVar25 = _DAT_006df1b0;
          auVar26 = _DAT_006df1c0;
          do {
            dVar24 = *(double *)((long)&_Var18._M_current[-uVar22].x + lVar14);
            if (dVar24 <= dVar27) {
              dVar27 = dVar24;
            }
            auVar3 = *(undefined1 (*) [16])((long)&_Var18._M_current[-uVar22].y + lVar14);
            auVar26 = minpd(auVar26,auVar3);
            if (dVar28 <= dVar24) {
              dVar28 = dVar24;
            }
            auVar25 = maxpd(auVar25,auVar3);
            lVar14 = lVar14 + 0x18;
          } while (uVar22 * 0x18 != lVar14);
          dVar24 = auVar25._0_8_ - auVar26._0_8_;
          dStack_40 = auVar25._8_8_ - auVar26._8_8_;
          local_48.epsilon =
               (dStack_40 * dStack_40 + (dVar28 - dVar27) * (dVar28 - dVar27) + dVar24 * dVar24) /
               1000000.0;
          _Var17 = std::
                   __unique<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Assimp::IFC::FuzzyVectorCompare>>
                             (_Var18._M_current + -uVar22,_Var18,
                              (_Iter_comp_iter<Assimp::IFC::FuzzyVectorCompare>)local_48.epsilon);
          _Var18._M_current =
               (local_100->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (_Var17._M_current != _Var18._M_current) {
            local_104 = local_104 +
                        (int)((ulong)((long)_Var18._M_current - (long)_Var17._M_current) >> 3) *
                        0x55555555;
            (local_100->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_finish = _Var17._M_current;
            _Var18 = _Var17;
          }
          uVar16 = (ulong)local_104;
          dVar27 = _Var18._M_current[-uVar16].x - _Var18._M_current[-1].x;
          dVar28 = _Var18._M_current[-uVar16].y - _Var18._M_current[-1].y;
          dVar24 = _Var18._M_current[-uVar16].z - _Var18._M_current[-1].z;
          if (ABS(dVar24 * dVar24 + dVar27 * dVar27 + dVar28 * dVar28) < local_48.epsilon) {
            _Var18._M_current = _Var18._M_current + -1;
            (local_100->mVerts).
            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
            super__Vector_impl_data._M_finish = _Var18._M_current;
            local_104 = local_104 - 1;
          }
          if (local_104 < 3) {
            if (local_104 != 0) {
              (local_100->mVerts).
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
              super__Vector_impl_data._M_finish = _Var18._M_current + (-1 - (ulong)(local_104 - 1));
            }
          }
          else {
            __position._M_current =
                 (local_100->mVertcnt).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (local_100->mVertcnt).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>(local_58,__position,&local_104);
            }
            else {
              *__position._M_current = local_104;
              ppuVar2 = &(local_100->mVertcnt).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppuVar2 = *ppuVar2 + 1;
            }
          }
        }
      }
      local_f8 = (ulong)((int)local_f8 + *puVar21);
      puVar21 = puVar21 + 1;
    } while (puVar21 != local_50);
  }
  LogFunctions<Assimp::IFCImporter>::LogDebug((char *)0x5be58d);
  return;
}

Assistant:

void ProcessBooleanHalfSpaceDifference(const Schema_2x3::IfcHalfSpaceSolid* hs, TempMesh& result,
    const TempMesh& first_operand,
    ConversionData& /*conv*/)
{
    ai_assert(hs != NULL);

    const Schema_2x3::IfcPlane* const plane = hs->BaseSurface->ToPtr<Schema_2x3::IfcPlane>();
    if(!plane) {
        IFCImporter::LogError("expected IfcPlane as base surface for the IfcHalfSpaceSolid");
        return;
    }

    // extract plane base position vector and normal vector
    IfcVector3 p,n(0.f,0.f,1.f);
    if (plane->Position->Axis) {
        ConvertDirection(n,plane->Position->Axis.Get());
    }
    ConvertCartesianPoint(p,plane->Position->Location);

    if(!IsTrue(hs->AgreementFlag)) {
        n *= -1.f;
    }

    // clip the current contents of `meshout` against the plane we obtained from the second operand
    const std::vector<IfcVector3>& in = first_operand.mVerts;
    std::vector<IfcVector3>& outvert = result.mVerts;

    std::vector<unsigned int>::const_iterator begin = first_operand.mVertcnt.begin(),
        end = first_operand.mVertcnt.end(), iit;

    outvert.reserve(in.size());
    result.mVertcnt.reserve(first_operand.mVertcnt.size());

    unsigned int vidx = 0;
    for(iit = begin; iit != end; vidx += *iit++) {

        unsigned int newcount = 0;
        bool isAtWhiteSide = (in[vidx] - p) * n > -1e-6;
        for( unsigned int i = 0; i < *iit; ++i ) {
            const IfcVector3& e0 = in[vidx + i], e1 = in[vidx + (i + 1) % *iit];

            // does the next segment intersect the plane?
            IfcVector3 isectpos;
            if( IntersectSegmentPlane(p, n, e0, e1, isAtWhiteSide, isectpos) ) {
                if( isAtWhiteSide ) {
                    // e0 is on the right side, so keep it
                    outvert.push_back(e0);
                    outvert.push_back(isectpos);
                    newcount += 2;
                }
                else {
                    // e0 is on the wrong side, so drop it and keep e1 instead
                    outvert.push_back(isectpos);
                    ++newcount;
                }
                isAtWhiteSide = !isAtWhiteSide;
            }
            else
            {
                if( isAtWhiteSide ) {
                    outvert.push_back(e0);
                    ++newcount;
                }
            }
        }

        if (!newcount) {
            continue;
        }

        IfcVector3 vmin,vmax;
        ArrayBounds(&*(outvert.end()-newcount),newcount,vmin,vmax);

        // filter our IfcFloat points - those may happen if a point lies
        // directly on the intersection line. However, due to IfcFloat
        // precision a bitwise comparison is not feasible to detect
        // this case.
        const IfcFloat epsilon = (vmax-vmin).SquareLength() / 1e6f;
        FuzzyVectorCompare fz(epsilon);

        std::vector<IfcVector3>::iterator e = std::unique( outvert.end()-newcount, outvert.end(), fz );

        if (e != outvert.end()) {
            newcount -= static_cast<unsigned int>(std::distance(e,outvert.end()));
            outvert.erase(e,outvert.end());
        }
        if (fz(*( outvert.end()-newcount),outvert.back())) {
            outvert.pop_back();
            --newcount;
        }
        if(newcount > 2) {
            result.mVertcnt.push_back(newcount);
        }
        else while(newcount-->0) {
            result.mVerts.pop_back();
        }

    }
    IFCImporter::LogDebug("generating CSG geometry by plane clipping (IfcBooleanClippingResult)");
}